

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O0

void GmmCreateMultiAdapterContext(void)

{
  GmmMultiAdapterContext *this;
  size_t in_RSI;
  undefined8 local_30;
  
  if (pGmmMALibContext == (GMM_MA_LIB_CONTEXT *)0x0) {
    this = (GmmMultiAdapterContext *)GmmMemAllocator::operator_new((GmmMemAllocator *)0xd8,in_RSI);
    local_30 = (GMM_MA_LIB_CONTEXT *)0x0;
    if (this != (GmmMultiAdapterContext *)0x0) {
      GmmLib::GmmMultiAdapterContext::GmmMultiAdapterContext(this);
      local_30 = this;
    }
    pGmmMALibContext = local_30;
  }
  return;
}

Assistant:

GMM_LIB_API_CONSTRUCTOR void GmmCreateMultiAdapterContext()
{
    if(!pGmmMALibContext)
    {
        // This is called only during dll load
        // Initializes the MA context.
	pGmmMALibContext = new GMM_MA_LIB_CONTEXT();
    }
}